

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O3

void __thiscall duckdb::Vector::Resize(Vector *this,idx_t current_size,idx_t new_size)

{
  optional_ptr<duckdb::VectorBuffer,_true> oVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar2;
  undefined8 uVar3;
  idx_t iVar4;
  Allocator *this_01;
  data_ptr_t pointer;
  OutOfRangeException *this_02;
  data_ptr_t in_RCX;
  StringUtil *this_03;
  optional_ptr<duckdb::VectorBuffer,_true> *this_04;
  pointer pRVar5;
  AllocatedData new_data;
  vector<duckdb::ResizeInfo,_true> resize_infos;
  undefined1 local_b8 [32];
  vector<duckdb::ResizeInfo,_true> local_98;
  idx_t local_80;
  pointer local_78;
  string local_70;
  string local_50;
  
  local_80 = current_size;
  if ((this->buffer).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    local_98.super_vector<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>.
    super__Vector_base<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)local_98.
                          super_vector<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>.
                          super__Vector_base<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    make_buffer<duckdb::VectorBuffer,int>((duckdb *)local_b8,(int *)&local_98);
    uVar3 = local_b8._8_8_;
    uVar2 = local_b8._0_8_;
    local_b8._0_8_ = (element_type *)0x0;
    local_b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (this->buffer).internal.
              super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (this->buffer).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)uVar2;
    (this->buffer).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
    if ((this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00),
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
    }
  }
  local_98.super_vector<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>.
  super__Vector_base<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super_vector<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>.
  super__Vector_base<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super_vector<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>.
  super__Vector_base<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FindResizeInfos(this,&local_98,1);
  local_78 = local_98.super_vector<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>.
             super__Vector_base<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (local_98.super_vector<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>.
      super__Vector_base<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_98.super_vector<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>.
      super__Vector_base<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this_04 = &(local_98.super_vector<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>.
                super__Vector_base<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>._M_impl.
                super__Vector_impl_data._M_start)->buffer;
    do {
      ValidityMask::Resize
                (&((ResizeInfo *)(this_04 + -2))->vec->validity,(long)this_04[1].ptr * new_size);
      if (this_04[-1].ptr != (VectorBuffer *)0x0) {
        iVar4 = GetTypeIdSize((((ResizeInfo *)(this_04 + -2))->vec->type).physical_type_);
        oVar1.ptr = this_04[1].ptr;
        this_03 = (StringUtil *)(iVar4 * new_size * (long)oVar1.ptr);
        if ((StringUtil *)0x2000000000 < this_03) {
          this_02 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          local_b8._0_8_ = local_b8 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_b8,
                     "Cannot resize vector to %s: maximum allowed vector size is %s","");
          StringUtil::BytesToHumanReadableString_abi_cxx11_(&local_50,this_03,0x400,(idx_t)in_RCX);
          StringUtil::BytesToHumanReadableString_abi_cxx11_
                    (&local_70,(StringUtil *)0x2000000000,0x400,(idx_t)in_RCX);
          OutOfRangeException::OutOfRangeException<std::__cxx11::string,std::__cxx11::string>
                    (this_02,(string *)local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70)
          ;
          __cxa_throw(this_02,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
        this_01 = Allocator::DefaultAllocator();
        pointer = Allocator::AllocateData(this_01,(idx_t)this_03);
        AllocatedData::AllocatedData((AllocatedData *)local_b8,this_01,pointer,(idx_t)this_03);
        switchD_012b9b0d::default
                  ((void *)local_b8._8_8_,this_04[-1].ptr,iVar4 * local_80 * (long)oVar1.ptr);
        optional_ptr<duckdb::VectorBuffer,_true>::CheckValid(this_04);
        AllocatedData::operator=(&this_04->ptr->data,(AllocatedData *)local_b8);
        optional_ptr<duckdb::VectorBuffer,_true>::CheckValid(this_04);
        in_RCX = (this_04->ptr->data).pointer;
        ((ResizeInfo *)(this_04 + -2))->vec->data = in_RCX;
        AllocatedData::~AllocatedData((AllocatedData *)local_b8);
      }
      pRVar5 = (pointer)(this_04 + 2);
      this_04 = this_04 + 4;
    } while (pRVar5 != local_78);
  }
  if (local_98.super_vector<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>.
      super__Vector_base<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super_vector<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>.
                    super__Vector_base<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Vector::Resize(idx_t current_size, idx_t new_size) {
	// The vector does not contain any data.
	if (!buffer) {
		buffer = make_buffer<VectorBuffer>(0);
	}

	// Obtain the resize information for each (nested) vector.
	vector<ResizeInfo> resize_infos;
	FindResizeInfos(resize_infos, 1);

	for (auto &resize_info_entry : resize_infos) {
		// Resize the validity mask.
		auto new_validity_size = new_size * resize_info_entry.multiplier;
		resize_info_entry.vec.validity.Resize(new_validity_size);

		// For nested data types, we only need to resize the validity mask.
		if (!resize_info_entry.data) {
			continue;
		}

		auto type_size = GetTypeIdSize(resize_info_entry.vec.GetType().InternalType());
		auto old_size = current_size * type_size * resize_info_entry.multiplier * sizeof(data_t);
		auto target_size = new_size * type_size * resize_info_entry.multiplier * sizeof(data_t);

		// We have an upper limit of 128GB for a single vector.
		if (target_size > DConstants::MAX_VECTOR_SIZE) {
			throw OutOfRangeException("Cannot resize vector to %s: maximum allowed vector size is %s",
			                          StringUtil::BytesToHumanReadableString(target_size),
			                          StringUtil::BytesToHumanReadableString(DConstants::MAX_VECTOR_SIZE));
		}

		// Copy the data buffer to a resized buffer.
		auto new_data = Allocator::DefaultAllocator().Allocate(target_size);
		memcpy(new_data.get(), resize_info_entry.data, old_size);
		resize_info_entry.buffer->SetData(std::move(new_data));
		resize_info_entry.vec.data = resize_info_entry.buffer->GetData();
	}
}